

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void enlarge(parse *p,sopno size)

{
  sop *psVar1;
  sop *sp;
  sopno size_local;
  parse *p_local;
  
  if (p->ssize < size) {
    psVar1 = (sop *)realloc(p->strip,size << 3);
    if (psVar1 == (sop *)0x0) {
      seterr(p,0xc);
    }
    else {
      p->strip = psVar1;
      p->ssize = size;
    }
  }
  return;
}

Assistant:

static void
enlarge(p, size)
struct parse *p;
sopno size;
{
	sop *sp;

	if (p->ssize >= size)
		return;

	sp = (sop *)realloc(p->strip, (size_t)size*sizeof(sop));
	if (sp == NULL) {
		seterr(p, REG_ESPACE);
		return;
	}
	p->strip = sp;
	p->ssize = size;
}